

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O1

void __thiscall DSBarInfo::ShowPop(DSBarInfo *this,int popnum)

{
  SBarInfo *pSVar1;
  int iVar2;
  bool bVar3;
  
  DBaseStatusBar::ShowPop(&this->super_DBaseStatusBar,popnum);
  iVar2 = this->currentPopup;
  bVar3 = false;
  if (iVar2 == popnum) {
    popnum = 0;
  }
  this->pendingPopup = popnum;
  if (iVar2 == 0) {
    iVar2 = this->pendingPopup;
    this->currentPopup = iVar2;
    this->pendingPopup = 0;
    bVar3 = true;
    if (iVar2 == 0) {
      return;
    }
  }
  pSVar1 = this->script;
  pSVar1->popups[(long)iVar2 + -1].opened = bVar3;
  pSVar1->popups[(long)iVar2 + -1].moving = true;
  return;
}

Assistant:

void ShowPop(int popnum)
	{
		DBaseStatusBar::ShowPop(popnum);
		if(popnum != currentPopup)
		{
			pendingPopup = popnum;
		}
		else
			pendingPopup = POP_None;
		if(currentPopup != POP_None)
			script->popups[currentPopup-1].close();
		else
		{
			currentPopup = pendingPopup;
			pendingPopup = POP_None;
			if(currentPopup != POP_None)
				script->popups[currentPopup-1].open();
		}
	}